

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrayops.c
# Opt level: O1

LispPTR N_OP_aref2(LispPTR arrayarg,LispPTR inx0,LispPTR inx1)

{
  uint uVar1;
  int iVar2;
  DLword *pDVar3;
  LispPTR LVar4;
  uint uVar5;
  uint uVar6;
  
  if ((*(ushort *)((ulong)(arrayarg >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 0xf) {
    MachineState.tosvalue = inx1;
    MachineState.errorexit = 1;
    return 0xffffffff;
  }
  if ((arrayarg & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)arrayarg);
  }
  pDVar3 = Lisp_world;
  uVar1 = *(uint *)(Lisp_world + arrayarg);
  if ((inx1 & 0xfff0000) == 0xe0000) {
    uVar6 = inx1 & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(inx1 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
      MachineState.tosvalue = inx1;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
    if ((inx1 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)inx1);
    }
    uVar6 = *(uint *)(Lisp_world + inx1);
    if ((int)uVar6 < 0) {
      MachineState.tosvalue = inx1;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
  }
  iVar2 = *(int *)(pDVar3 + (ulong)arrayarg + 8);
  if (iVar2 <= (int)uVar6) {
    MachineState.tosvalue = inx1;
    MachineState.errorexit = 1;
    return 0xffffffff;
  }
  if ((inx0 & 0xfff0000) == 0xe0000) {
    uVar5 = inx0 & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(inx0 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
      MachineState.tosvalue = inx1;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
    if ((inx0 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)inx0);
    }
    uVar5 = *(uint *)(Lisp_world + inx0);
    if ((int)uVar5 < 0) {
      MachineState.tosvalue = inx1;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
  }
  if (*(int *)(pDVar3 + (ulong)arrayarg + 4) <= (int)uVar5) {
    MachineState.tosvalue = inx1;
    MachineState.errorexit = 1;
    return 0xffffffff;
  }
  LVar4 = aref_switch((uint)(byte)pDVar3[(ulong)arrayarg + 3],inx1,uVar1 & 0xfffffff,
                      uVar5 * iVar2 + uVar6);
  return LVar4;
}

Assistant:

LispPTR N_OP_aref2(LispPTR arrayarg, LispPTR inx0, LispPTR inx1) {
  LispPTR baseL;
  int arindex, temp;
  LispArray *arrayblk;
  int j;

  /*  verify array  */
  if (GetTypeNumber(arrayarg) != TYPE_TWOD_ARRAY) ERROR_EXIT(inx1);
  arrayblk = (LispArray *)NativeAligned4FromLAddr(arrayarg);
  baseL = arrayblk->base;

  /*  test and setup index  */
  N_GetPos(inx1, temp, inx1);
  if (temp >= (j = arrayblk->Dim1)) ERROR_EXIT(inx1);
  N_GetPos(inx0, arindex, inx1);
  if (arindex >= arrayblk->Dim0) ERROR_EXIT(inx1);
  arindex *= j;
  arindex += temp;

  /*  disp on type  */
  return (aref_switch(arrayblk->typenumber, inx1, baseL, arindex));
}